

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

void __thiscall Minisat::Solver::~Solver(Solver *this)

{
  this->_vptr_Solver = (_func_int **)&PTR__Solver_0011bbd8;
  vec<Minisat::Lit,_int>::~vec(&this->add_tmp);
  vec<Minisat::Lit,_int>::~vec(&this->analyze_toclear);
  vec<Minisat::Solver::ShrinkStackElem,_int>::~vec(&this->analyze_stack);
  vec<char,_int>::~vec((vec<char,_int> *)&this->seen);
  vec<int,_int>::~vec(&this->free_vars);
  vec<int,_int>::~vec(&this->released_vars);
  RegionAllocator<unsigned_int>::~RegionAllocator(&(this->ca).ra);
  Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_>::~Heap(&this->order_heap);
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
  ::~OccLists(&this->watches);
  vec<Minisat::Solver::VarData,_int>::~vec((vec<Minisat::Solver::VarData,_int> *)&this->vardata);
  vec<char,_int>::~vec((vec<char,_int> *)&this->decision);
  vec<Minisat::lbool,_int>::~vec((vec<Minisat::lbool,_int> *)&this->user_pol);
  vec<char,_int>::~vec((vec<char,_int> *)&this->polarity);
  vec<Minisat::lbool,_int>::~vec((vec<Minisat::lbool,_int> *)&this->assigns);
  vec<double,_int>::~vec((vec<double,_int> *)&this->activity);
  vec<Minisat::Lit,_int>::~vec(&this->assumptions);
  vec<int,_int>::~vec(&this->trail_lim);
  vec<Minisat::Lit,_int>::~vec(&this->trail);
  vec<unsigned_int,_int>::~vec(&this->learnts);
  vec<unsigned_int,_int>::~vec(&this->clauses);
  IntSet<Minisat::Lit,_Minisat::MkIndexLit>::~IntSet
            (&(this->conflict).super_IntSet<Minisat::Lit,_Minisat::MkIndexLit>);
  vec<Minisat::lbool,_int>::~vec(&this->model);
  return;
}

Assistant:

Solver::~Solver()
{
}